

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

void __thiscall Matrix<Complex>::inverseExt(Matrix<Complex> *this,Matrix<Complex> *ext)

{
  ulong uVar1;
  undefined8 *puVar2;
  Complex *pCVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  matrix_error *this_00;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  Complex coeff;
  Complex local_148;
  long local_c0;
  ulong local_b8;
  Complex local_b0;
  
  if (this->N == this->M) {
    if (this->N == ext->M) {
      uVar5 = gauss(this,ext);
      if (uVar5 == this->N) {
        if (uVar5 != 0) {
          uVar10 = (ulong)uVar5;
          do {
            uVar5 = uVar5 - 1;
            uVar1 = uVar10 - 1;
            Complex::Complex(&local_148,1);
            iVar7 = (int)uVar1;
            ::operator/(&local_b0,&local_148,
                        this->arr + (ulong)(this->N * iVar7) + (uVar1 & 0xffffffff));
            if (local_148._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148._im._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_148._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148._im._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_148._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148._re._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_148._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148._re._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar9 = (ulong)this->N;
            if (this->N == 0) {
              uVar9 = 0;
            }
            else {
              lVar11 = 0;
              uVar8 = 0;
              do {
                Complex::operator*=((Complex *)
                                    ((long)&this->arr[(int)uVar9 * uVar5]._re._numerator.digits.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar11),
                                    &local_b0);
                uVar8 = uVar8 + 1;
                uVar9 = (ulong)this->N;
                lVar11 = lVar11 + 0x80;
              } while (uVar8 < uVar9);
            }
            uVar8 = (ulong)ext->N;
            if (ext->N != 0) {
              lVar11 = 0;
              uVar9 = 0;
              do {
                Complex::operator*=((Complex *)
                                    ((long)&ext->arr[(int)uVar8 * uVar5]._re._numerator.digits.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar11),
                                    &local_b0);
                uVar9 = uVar9 + 1;
                uVar8 = (ulong)ext->N;
                lVar11 = lVar11 + 0x80;
              } while (uVar9 < uVar8);
              uVar9 = (ulong)this->N;
            }
            if (uVar10 < uVar9) {
              do {
                uVar6 = (int)uVar9 * iVar7;
                pCVar3 = this->arr;
                if ((pCVar3[uVar6 + uVar10]._re._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                     pCVar3[uVar6 + uVar10]._re._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish) ||
                   (pCVar3[uVar6 + uVar10]._im._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    pCVar3[uVar6 + uVar10]._im._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish)) {
                  uVar9 = (ulong)ext->N;
                  lVar11 = uVar10 * 0x80;
                  if (ext->N != 0) {
                    lVar12 = 0;
                    uVar8 = 0;
                    local_c0 = uVar10 * 0x80;
                    local_b8 = uVar10;
                    do {
                      ::operator*(&local_148,
                                  (Complex *)
                                  ((long)&ext->arr[(uint)((int)uVar9 * (int)uVar10)]._re._numerator.
                                          digits.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar12),
                                  (Complex *)
                                  ((long)&this->arr[this->N * iVar7]._re._numerator.digits.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + local_c0));
                      Complex::operator-=((Complex *)
                                          ((long)&ext->arr[ext->N * uVar5]._re._numerator.digits.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar12
                                          ),&local_148);
                      if (local_148._im._denominator.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_148._im._denominator.digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_148._im._numerator.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_148._im._numerator.digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      uVar10 = local_b8;
                      if (local_148._re._denominator.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_148._re._denominator.digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_148._re._numerator.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_148._re._numerator.digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      uVar8 = uVar8 + 1;
                      uVar9 = (ulong)ext->N;
                      lVar12 = lVar12 + 0x80;
                      lVar11 = local_c0;
                    } while (uVar8 < uVar9);
                  }
                  Complex::Complex(&local_148);
                  uVar6 = this->N * iVar7;
                  pCVar3 = this->arr;
                  pvVar4 = *(void **)((long)&pCVar3[uVar6]._re._numerator.digits.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar11);
                  puVar2 = (undefined8 *)
                           ((long)&pCVar3[uVar6]._re._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar11);
                  *puVar2 = local_148._re._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  puVar2[1] = local_148._re._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._re._numerator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar11) =
                       local_148._re._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_148._re._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_148._re._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_148._re._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (pvVar4 != (void *)0x0) {
                    operator_delete(pvVar4);
                  }
                  (&pCVar3[uVar6]._re._numerator.negative)[lVar11] =
                       local_148._re._numerator.negative;
                  pvVar4 = *(void **)((long)&pCVar3[uVar6]._re._denominator.digits.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar11);
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._re._denominator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar11) =
                       local_148._re._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._re._denominator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish + lVar11) =
                       local_148._re._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._re._denominator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar11) =
                       local_148._re._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_148._re._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_148._re._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_148._re._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (pvVar4 != (void *)0x0) {
                    operator_delete(pvVar4);
                  }
                  (&pCVar3[uVar6]._re._denominator.negative)[lVar11] =
                       local_148._re._denominator.negative;
                  pvVar4 = *(void **)((long)&pCVar3[uVar6]._im._numerator.digits.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar11);
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._im._numerator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar11) =
                       local_148._im._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._im._numerator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish + lVar11) =
                       local_148._im._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._im._numerator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar11) =
                       local_148._im._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_148._im._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_148._im._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_148._im._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (pvVar4 != (void *)0x0) {
                    operator_delete(pvVar4);
                  }
                  (&pCVar3[uVar6]._im._numerator.negative)[lVar11] =
                       local_148._im._numerator.negative;
                  pvVar4 = *(void **)((long)&pCVar3[uVar6]._im._denominator.digits.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar11);
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._im._denominator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar11) =
                       local_148._im._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._im._denominator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish + lVar11) =
                       local_148._im._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  *(pointer *)
                   ((long)&pCVar3[uVar6]._im._denominator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar11) =
                       local_148._im._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_148._im._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_148._im._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_148._im._denominator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (pvVar4 == (void *)0x0) {
                    (&pCVar3[uVar6]._im._denominator.negative)[lVar11] =
                         local_148._im._denominator.negative;
                  }
                  else {
                    operator_delete(pvVar4);
                    (&pCVar3[uVar6]._im._denominator.negative)[lVar11] =
                         local_148._im._denominator.negative;
                    if (local_148._im._denominator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_148._im._denominator.digits.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  if (local_148._im._numerator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_148._im._numerator.digits.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_148._re._denominator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_148._re._denominator.digits.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_148._re._numerator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_148._re._numerator.digits.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  uVar9 = (ulong)this->N;
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 < uVar9);
            }
            if (local_b0._im._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0._im._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0._im._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0._im._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0._re._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0._re._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0._re._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0._re._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar10 = uVar1;
          } while (iVar7 != 0);
        }
        return;
      }
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Cannot inverse a singular matrix");
    }
    else {
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Invalid use of inverseExt");
    }
  }
  else {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Trying to inverse a non-square matrix");
  }
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Matrix<Field>::inverseExt(Matrix &ext)
{
    if(N != M)
        throw matrix_error("Trying to inverse a non-square matrix");
    if(M != ext.M)
    {
        throw matrix_error("Invalid use of inverseExt");
    }
    if(gauss(&ext) != N)
    {
        throw matrix_error("Cannot inverse a singular matrix");
    }
    for(unsigned i = N - 1; i != unsigned(-1); --i)
    {
        Field coeff = Field(1) / (*this)[i][i];
        for(unsigned j = 0; j < N; ++j)
        {
            (*this)[i][j] *= coeff;
        }
        for(unsigned j = 0; j < ext.N; ++j)
        {
            ext[i][j] *= coeff;
        }
        for(unsigned j = i + 1; j < N; j++)
        {
            if(!(*this)[i][j])
                continue;
            for(unsigned q = 0; q < ext.N; q++)
            {
                ext[i][q] -= ext[j][q] * (*this)[i][j];
            }
            (*this)[i][j] = Field();
        }
    }
}